

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptMatrixTemplateType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TType *pTVar4;
  undefined4 extraout_var;
  TConstUnionArray *pTVar5;
  TConstUnion *pTVar6;
  undefined4 extraout_var_00;
  TIntermTyped *local_38;
  TIntermTyped *cols;
  TIntermTyped *rows;
  TPrecisionQualifier precision;
  TBasicType basicType;
  TType *type_local;
  HlslGrammar *this_local;
  
  _precision = type;
  type_local = (TType *)this;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokMatrix);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
    if (bVar1) {
      bVar1 = acceptTemplateVecMatBasicType
                        (this,(TBasicType *)((long)&rows + 4),(TPrecisionQualifier *)&rows);
      if (bVar1) {
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
        if (bVar1) {
          bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
          if (bVar1) {
            bVar1 = acceptLiteral(this,&cols);
            if (bVar1) {
              bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
              if (bVar1) {
                bVar1 = HlslTokenStream::peekTokenClass
                                  (&this->super_HlslTokenStream,EHTokIntConstant);
                if (bVar1) {
                  bVar1 = acceptLiteral(this,&local_38);
                  if (bVar1) {
                    pTVar4 = (TType *)TType::operator_new(0x98,_precision);
                    iVar2 = (*(cols->super_TIntermNode)._vptr_TIntermNode[5])();
                    pTVar5 = TIntermConstantUnion::getConstArray
                                       ((TIntermConstantUnion *)CONCAT44(extraout_var,iVar2));
                    pTVar6 = TConstUnionArray::operator[](pTVar5,0);
                    iVar2 = TConstUnion::getIConst(pTVar6);
                    iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[5])();
                    pTVar5 = TIntermConstantUnion::getConstArray
                                       ((TIntermConstantUnion *)CONCAT44(extraout_var_00,iVar3));
                    pTVar6 = TConstUnionArray::operator[](pTVar5,0);
                    iVar3 = TConstUnion::getIConst(pTVar6);
                    TType::TType(pTVar4,rows._4_4_,EvqTemporary,(TPrecisionQualifier)rows,0,iVar2,
                                 iVar3,false);
                    bVar1 = HlslTokenStream::acceptTokenClass
                                      (&this->super_HlslTokenStream,EHTokRightAngle);
                    if (bVar1) {
                      this_local._7_1_ = true;
                    }
                    else {
                      expected(this,"right angle bracket");
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  expected(this,"literal integer");
                  this_local._7_1_ = false;
                }
              }
              else {
                expected(this,",");
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            expected(this,"literal integer");
            this_local._7_1_ = false;
          }
        }
        else {
          expected(this,",");
          this_local._7_1_ = false;
        }
      }
      else {
        expected(this,"scalar type");
        this_local._7_1_ = false;
      }
    }
    else {
      pTVar4 = (TType *)TType::operator_new(0x98,_precision);
      TType::TType(pTVar4,EbtFloat,EvqTemporary,0,4,4,false);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptMatrixTemplateType(TType& type)
{
    if (! acceptTokenClass(EHTokMatrix))
        return false;

    if (! acceptTokenClass(EHTokLeftAngle)) {
        // in HLSL, 'matrix' alone means float4x4.
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 4);
        return true;
    }

    TBasicType basicType;
    TPrecisionQualifier precision;
    if (! acceptTemplateVecMatBasicType(basicType, precision)) {
        expected("scalar type");
        return false;
    }

    // COMMA
    if (! acceptTokenClass(EHTokComma)) {
        expected(",");
        return false;
    }

    // integer rows
    if (! peekTokenClass(EHTokIntConstant)) {
        expected("literal integer");
        return false;
    }

    TIntermTyped* rows;
    if (! acceptLiteral(rows))
        return false;

    // COMMA
    if (! acceptTokenClass(EHTokComma)) {
        expected(",");
        return false;
    }

    // integer cols
    if (! peekTokenClass(EHTokIntConstant)) {
        expected("literal integer");
        return false;
    }

    TIntermTyped* cols;
    if (! acceptLiteral(cols))
        return false;

    new(&type) TType(basicType, EvqTemporary, precision, 0,
                     rows->getAsConstantUnion()->getConstArray()[0].getIConst(),
                     cols->getAsConstantUnion()->getConstArray()[0].getIConst());

    if (!acceptTokenClass(EHTokRightAngle)) {
        expected("right angle bracket");
        return false;
    }

    return true;
}